

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O3

int __thiscall Imf_2_5::TimeCode::binaryGroup(TimeCode *this,int group)

{
  ArgExc *this_00;
  
  if (0xfffffff7 < group - 9U) {
    return this->_user >> ((char)(group << 2) - 4U & 0x1f) & 0xf;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (this_00,
             "Cannot extract binary group from time code user data.  Group number is out of range.")
  ;
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

int
TimeCode::binaryGroup (int group) const
{
    if (group < 1 || group > 8)
	throw IEX_NAMESPACE::ArgExc ("Cannot extract binary group from time code "
		           "user data.  Group number is out of range.");

    int minBit = 4 * (group - 1);
    int maxBit = minBit + 3;
    return int (bitField (_user, minBit, maxBit));
}